

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O2

int gray_raster_render(QT_FT_Raster raster,QT_FT_Raster_Params *params)

{
  QT_FT_BBox *pQVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QT_FT_Bitmap *pQVar5;
  int *piVar6;
  PWorker worker;
  QT_FT_Vector *pQVar7;
  PCell_conflict pTVar8;
  undefined1 auVar9 [16];
  char *pcVar10;
  int *piVar11;
  QT_FT_Pos QVar12;
  QT_FT_Pos QVar13;
  QT_FT_Pos QVar14;
  short sVar15;
  char cVar16;
  char cVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  PCell_conflict *ppTVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  TCoord x;
  int iVar27;
  QT_FT_Vector *pQVar28;
  QT_FT_Vector *pQVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  PCell *ppTVar34;
  long in_FS_OFFSET;
  TBand *band;
  int num_bands;
  int n;
  TPos max;
  TPos min;
  TBand bands [40];
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  iVar20 = -3;
  iVar27 = iVar20;
  if (((raster == (QT_FT_Raster)0x0) ||
      (ppTVar23 = (PCell_conflict *)raster->buffer, ppTVar23 == (PCell_conflict *)0x0)) ||
     (lVar21 = raster->buffer_size, lVar21 == 0)) goto LAB_0034d228;
  pQVar5 = params->target;
  piVar6 = (int *)params->source;
  worker = raster->worker;
  worker->skip_spans = params->skip_spans;
  if (raster->buffer_allocated_size < 0x2000) {
LAB_0034d187:
    iVar27 = -6;
    goto LAB_0034d228;
  }
  iVar27 = -1;
  if (piVar6 == (int *)0x0) goto LAB_0034d228;
  if ((piVar6[1] == 0) || ((long)*piVar6 < 1)) {
LAB_0034d253:
    iVar27 = 0;
  }
  else {
    if ((*(long *)(piVar6 + 6) == 0) ||
       ((*(long *)(piVar6 + 2) == 0 ||
        (piVar6[1] != *(int *)(*(long *)(piVar6 + 6) + -4 + (long)*piVar6 * 4) + 1))))
    goto LAB_0034d228;
    uVar30 = params->flags;
    if ((uVar30 & 2) == 0) {
      iVar27 = iVar20;
      if (pQVar5 == (QT_FT_Bitmap *)0x0) goto LAB_0034d228;
      iVar2 = pQVar5->width;
      if (iVar2 == 0) goto LAB_0034d253;
      iVar3 = pQVar5->rows;
      iVar27 = 0;
      if (((iVar3 == 0) || (iVar27 = iVar20, pQVar5->buffer == (uchar *)0x0)) ||
         (iVar27 = -2, (uVar30 & 1) == 0)) goto LAB_0034d228;
      (worker->clip_box).xMin = 0;
      (worker->clip_box).yMin = 0;
      (worker->clip_box).xMax = iVar2;
      (worker->clip_box).yMax = iVar3;
    }
    else {
      iVar27 = -2;
      if ((uVar30 & 1) == 0) goto LAB_0034d228;
      pQVar1 = &worker->clip_box;
      if ((uVar30 & 4) == 0) {
        pQVar1->xMin = -0x800000;
        pQVar1->yMin = -0x800000;
        (worker->clip_box).xMax = 0x7fffff;
        (worker->clip_box).yMax = 0x7fffff;
      }
      else {
        QVar12 = (params->clip_box).yMin;
        QVar13 = (params->clip_box).xMax;
        QVar14 = (params->clip_box).yMax;
        pQVar1->xMin = (params->clip_box).xMin;
        pQVar1->yMin = QVar12;
        (worker->clip_box).xMax = QVar13;
        (worker->clip_box).yMax = QVar14;
        ppTVar23 = (PCell_conflict *)raster->buffer;
        lVar21 = raster->buffer_size;
      }
    }
    worker->buffer = ppTVar23;
    worker->buffer_size = lVar21;
    worker->ycells = ppTVar23;
    worker->area = 0;
    worker->cover = 0;
    worker->invalid = 1;
    worker->num_cells = 0;
    worker->cells = (PCell_conflict)0x0;
    worker->max_cells = 0;
    iVar27 = piVar6[1];
    pQVar7 = *(QT_FT_Vector **)(piVar6 + 2);
    pcVar10 = *(char **)(piVar6 + 4);
    piVar11 = *(int **)(piVar6 + 6);
    (worker->outline).n_contours = piVar6[0];
    (worker->outline).n_points = iVar27;
    (worker->outline).points = pQVar7;
    (worker->outline).tags = pcVar10;
    (worker->outline).contours = piVar11;
    iVar27 = piVar6[9];
    (worker->outline).flags = piVar6[8];
    *(int *)&(worker->outline).field_0x24 = iVar27;
    worker->invalid = 1;
    iVar20 = raster->band_size;
    worker->band_size = iVar20;
    if (pQVar5 != (QT_FT_Bitmap *)0x0) {
      (worker->target).palette = pQVar5->palette;
      iVar27 = pQVar5->rows;
      iVar2 = pQVar5->width;
      iVar3 = pQVar5->pitch;
      uVar19 = *(undefined4 *)&pQVar5->field_0xc;
      sVar15 = pQVar5->num_grays;
      cVar16 = pQVar5->pixel_mode;
      cVar17 = pQVar5->palette_mode;
      uVar18 = *(undefined4 *)&pQVar5->field_0x1c;
      (worker->target).buffer = pQVar5->buffer;
      (worker->target).num_grays = sVar15;
      (worker->target).pixel_mode = cVar16;
      (worker->target).palette_mode = cVar17;
      *(undefined4 *)&(worker->target).field_0x1c = uVar18;
      (worker->target).rows = iVar27;
      (worker->target).width = iVar2;
      (worker->target).pitch = iVar3;
      *(undefined4 *)&(worker->target).field_0xc = uVar19;
    }
    worker->render_span = gray_render_span;
    worker->render_span_data = worker;
    if ((params->flags & 2) != 0) {
      worker->render_span = params->gray_spans;
      worker->render_span_data = params->user;
    }
    memset(bands,0xaa,0x280);
    worker->num_gray_spans = 0;
    lVar21 = (long)(worker->outline).n_points;
    if (lVar21 < 1) {
      worker->min_ey = 0;
      worker->max_ey = 0;
      worker->min_ex = 0;
      worker->max_ex = 0;
      min = 0;
      lVar22 = 0;
      lVar24 = 0;
      lVar21 = 0;
    }
    else {
      pQVar7 = (worker->outline).points;
      lVar22 = (long)pQVar7->x;
      lVar26 = (long)pQVar7->y;
      lVar24 = lVar22;
      pQVar29 = pQVar7;
      lVar31 = lVar26;
      while (pQVar28 = pQVar29 + 1, pQVar28 < pQVar7 + lVar21) {
        lVar33 = (long)pQVar28->x;
        lVar32 = (long)pQVar29[1].y;
        if (lVar33 < lVar24) {
          worker->min_ex = lVar33;
          lVar24 = lVar33;
        }
        if (lVar22 < lVar33) {
          worker->max_ex = lVar33;
          lVar22 = lVar33;
        }
        if (lVar32 < lVar26) {
          worker->min_ey = lVar32;
          lVar26 = lVar32;
        }
        pQVar29 = pQVar28;
        if (lVar31 < lVar32) {
          worker->max_ey = lVar32;
          lVar31 = lVar32;
        }
      }
      lVar24 = lVar24 >> 6;
      worker->min_ex = lVar24;
      min = lVar26 >> 6;
      worker->min_ey = min;
      lVar21 = lVar22 + 0x3f >> 6;
      worker->max_ex = lVar21;
      lVar22 = lVar31 + 0x3f >> 6;
      worker->max_ey = lVar22;
    }
    lVar26 = (long)(worker->clip_box).xMin;
    iVar27 = 0;
    if (((lVar26 < lVar21) && (lVar31 = (long)(worker->clip_box).xMax, lVar24 < lVar31)) &&
       ((lVar32 = (long)(worker->clip_box).yMin, lVar32 < lVar22 &&
        (lVar33 = (long)(worker->clip_box).yMax, min < lVar33)))) {
      if (lVar24 < lVar26) {
        worker->min_ex = lVar26;
        lVar24 = lVar26;
      }
      if (min < lVar32) {
        worker->min_ey = lVar32;
        min = lVar32;
      }
      if (lVar31 < lVar21) {
        worker->max_ex = lVar31;
        lVar21 = lVar31;
      }
      if (lVar33 < lVar22) {
        worker->max_ey = lVar33;
        lVar22 = lVar33;
      }
      worker->count_ex = lVar21 - lVar24;
      worker->count_ey = lVar22 - min;
      num_bands = (int)((lVar22 - min) / (long)iVar20);
      if (num_bands == 0) {
        num_bands = 1;
      }
      if (0x26 < num_bands) {
        num_bands = 0x27;
      }
      worker->band_shoot = 0;
      for (n = 0; band = bands, n < num_bands; n = n + 1) {
        max = worker->band_size + min;
        if ((n == num_bands + -1) || (lVar22 < max)) {
          max = lVar22;
        }
        bands[0].min = min;
        bands[0].max = max;
        while (bands <= band) {
          worker->ycells = (PCell_conflict *)worker->buffer;
          lVar21 = band->max - band->min;
          worker->ycount = lVar21;
          iVar20 = (int)lVar21 * 8;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = (long)iVar20;
          iVar27 = (iVar20 - SUB164(auVar9 % ZEXT816(0x18),0)) + 0x18;
          if (SUB168(auVar9 % ZEXT816(0x18),0) == 0) {
            iVar27 = iVar20;
          }
          iVar20 = (int)worker->buffer_size;
          lVar24 = (long)(iVar20 - (int)((ulong)(long)iVar20 % 0x18));
          lVar26 = (long)iVar27;
          worker->cells = (PCell_conflict)((long)worker->buffer + lVar26);
          lVar31 = lVar24 - lVar26;
          if ((lVar31 == 0 || lVar24 < lVar26) || (worker->max_cells = lVar31 / 0x18, lVar31 < 0x30)
             ) {
LAB_0034d730:
            lVar21 = band->min;
            lVar26 = band->max;
            if ((ulong)(lVar26 - lVar21) < 2) goto LAB_0034d187;
            if ((long)worker->band_size <= lVar21 - lVar26) {
              worker->band_shoot = worker->band_shoot + 1;
            }
            lVar24 = (lVar26 - lVar21 >> 1) + lVar21;
            band[1].min = lVar21;
            band[1].max = lVar24;
            band->min = lVar24;
            band->max = lVar26;
            band = band + 1;
          }
          else {
            if (lVar21 < 1) {
              lVar21 = 0;
            }
            for (lVar26 = 0; lVar21 != lVar26; lVar26 = lVar26 + 1) {
              worker->ycells[lVar26] = (PCell_conflict)0x0;
            }
            worker->num_cells = 0;
            worker->invalid = 1;
            worker->min_ey = band->min;
            worker->max_ey = band->max;
            worker->count_ey = band->max - band->min;
            iVar20 = gray_convert_glyph_inner(worker);
            if (iVar20 == -4) goto LAB_0034d730;
            iVar27 = 1;
            if (iVar20 != 0) goto LAB_0034d228;
            if (worker->num_cells != 0) {
              for (lVar21 = 0; lVar21 < worker->ycount; lVar21 = lVar21 + 1) {
                ppTVar34 = worker->ycells + lVar21;
                lVar26 = 0;
                x = 0;
                while( true ) {
                  pTVar8 = *ppTVar34;
                  if (pTVar8 == (PCell_conflict)0x0) break;
                  uVar30 = pTVar8->x;
                  if ((lVar26 != 0) && (x < (int)uVar30)) {
                    gray_hline(worker,x,lVar21,lVar26 << 9,uVar30 - (int)x);
                    uVar30 = pTVar8->x;
                  }
                  lVar26 = lVar26 + pTVar8->cover;
                  lVar24 = lVar26 * 0x200 - pTVar8->area;
                  if ((lVar24 != 0) && (-1 < (int)uVar30)) {
                    gray_hline(worker,(ulong)uVar30,lVar21,lVar24,1);
                    uVar30 = pTVar8->x;
                  }
                  x = (TCoord)(int)(uVar30 + 1);
                  ppTVar34 = &pTVar8->next;
                }
                if ((lVar26 != 0) && (x < worker->count_ex)) {
                  gray_hline(worker,x,lVar21,lVar26 << 9,(int)worker->count_ex - (int)x);
                }
              }
            }
            band = band + -1;
          }
        }
        min = max;
      }
      iVar27 = worker->num_gray_spans;
      uVar30 = worker->skip_spans;
      if ((int)uVar30 < iVar27 && worker->render_span != (QT_FT_SpanFunc)0x0) {
        uVar25 = 0;
        if (0 < (int)uVar30) {
          uVar25 = (ulong)uVar30;
        }
        (*worker->render_span)
                  (iVar27 - (int)uVar25,worker->gray_spans + uVar25,worker->render_span_data);
        iVar27 = worker->num_gray_spans;
        uVar30 = worker->skip_spans;
      }
      worker->skip_spans = uVar30 - iVar27;
      iVar27 = 0;
      if ((8 < worker->band_shoot) && (0x10 < worker->band_size)) {
        worker->band_size = (uint)worker->band_size >> 1;
      }
    }
  }
LAB_0034d228:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return iVar27;
}

Assistant:

static int
  gray_raster_render( QT_FT_Raster                  raster,
                      const QT_FT_Raster_Params*  params )
  {
    const QT_FT_Outline*  outline    = (const QT_FT_Outline*)params->source;
    const QT_FT_Bitmap*   target_map = params->target;
    PWorker            worker;


    if ( !raster || !raster->buffer || !raster->buffer_size )
      return ErrRaster_Invalid_Argument;

    /* Should always be non-null, it is set by raster_reset() which is always */
    /* called with a non-null pool, and a pool_size >= MINIMUM_POOL_SIZE.     */
    assert(raster->worker);

    raster->worker->skip_spans = params->skip_spans;

    /* If raster object and raster buffer are allocated, but  */
    /* raster size isn't of the minimum size, indicate out of */
    /* memory.                                                */
    if (raster->buffer_allocated_size < MINIMUM_POOL_SIZE )
      return ErrRaster_OutOfMemory;

    if ( !outline )
      return ErrRaster_Invalid_Outline;

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return ErrRaster_Invalid_Outline;

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return ErrRaster_Invalid_Outline;

    worker = raster->worker;

    /* if direct mode is not set, we must have a target bitmap */
    if ( ( params->flags & QT_FT_RASTER_FLAG_DIRECT ) == 0 )
    {
      if ( !target_map )
        return ErrRaster_Invalid_Argument;

      /* nothing to do */
      if ( !target_map->width || !target_map->rows )
        return 0;

      if ( !target_map->buffer )
        return ErrRaster_Invalid_Argument;
    }

    /* this version does not support monochrome rendering */
    if ( !( params->flags & QT_FT_RASTER_FLAG_AA ) )
      return ErrRaster_Invalid_Mode;

    /* compute clipping box */
    if ( ( params->flags & QT_FT_RASTER_FLAG_DIRECT ) == 0 )
    {
      /* compute clip box from target pixmap */
      ras.clip_box.xMin = 0;
      ras.clip_box.yMin = 0;
      ras.clip_box.xMax = target_map->width;
      ras.clip_box.yMax = target_map->rows;
    }
    else if ( params->flags & QT_FT_RASTER_FLAG_CLIP )
    {
      ras.clip_box = params->clip_box;
    }
    else
    {
      ras.clip_box.xMin = -(1 << 23);
      ras.clip_box.yMin = -(1 << 23);
      ras.clip_box.xMax =  (1 << 23) - 1;
      ras.clip_box.yMax =  (1 << 23) - 1;
    }

    gray_init_cells( worker, raster->buffer, raster->buffer_size );

    ras.outline   = *outline;
    ras.num_cells = 0;
    ras.invalid   = 1;
    ras.band_size = raster->band_size;

    if ( target_map )
      ras.target = *target_map;

    ras.render_span      = (QT_FT_Raster_Span_Func)gray_render_span;
    ras.render_span_data = &ras;

    if ( params->flags & QT_FT_RASTER_FLAG_DIRECT )
    {
      ras.render_span      = (QT_FT_Raster_Span_Func)params->gray_spans;
      ras.render_span_data = params->user;
    }

    return gray_convert_glyph( worker );
  }